

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O1

Image * Image_Function_Helper::BitwiseOr
                  (Image *__return_storage_ptr__,BitwiseOrForm4 bitwiseOr,Image *in1,Image *in2)

{
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(in1,in2);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (__return_storage_ptr__,in1,in1->_width,in1->_height,in1->_colorCount,'\x01');
  (*bitwiseOr)(in1,0,0,in2,0,0,__return_storage_ptr__,0,0,__return_storage_ptr__->_width,
               __return_storage_ptr__->_height);
  return __return_storage_ptr__;
}

Assistant:

Image BitwiseOr( FunctionTable::BitwiseOrForm4 bitwiseOr,
                     const Image & in1, const Image & in2 )
    {
        Image_Function::ParameterValidation( in1, in2 );

        Image out = in1.generate( in1.width(), in1.height(), in1.colorCount() );

        bitwiseOr( in1, 0, 0, in2, 0, 0, out, 0, 0, out.width(), out.height() );

        return out;
    }